

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QWidget*,QList<QGesture*>>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QWidget_*,_QList<QGesture_*>_> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  undefined8 uVar3;
  QDebug this_00;
  ulong uVar4;
  Stream *__old_val;
  storage_type *psVar5;
  storage_type *psVar6;
  ulong uVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  undefined1 local_78 [8];
  QDebug local_70;
  QDebug local_68;
  QTextStream *local_60;
  QWidgetData *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar6;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar6;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar2 = *(QTextStream **)debug.stream;
  QVar10.m_data = (storage_type *)0x1;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar8 = c->d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else if (pDVar8->spans->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      if (pDVar8->numBuckets == uVar7) {
        pDVar8 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar4 = uVar7 + 1;
    } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    goto LAB_002e5d43;
  }
  uVar7 = 0;
LAB_002e5d43:
  if (uVar7 != 0 || pDVar8 != (Data *)0x0) {
    do {
      QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78 = *(undefined1 (*) [8])debug.stream;
      *(int *)((long)local_78 + 0x28) = *(int *)((long)local_78 + 0x28) + 1;
      ::operator<<((Stream *)&local_70,(QWidget *)local_78);
      this_00.stream = local_70.stream;
      QVar11.m_data = (storage_type *)0x2;
      QVar11.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
      local_68.stream = (Stream *)0x0;
      local_50[0] = (QArrayData *)local_70.stream;
      printSequentialContainer<QList<QGesture*>>
                ((QtPrivate *)&local_60,(Stream *)local_50,"QList",
                 (QList<QGesture_*> *)
                 (pDVar8->spans[uVar7 >> 7].entries
                  [pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].storage.data + 8));
      QDebug::~QDebug((QDebug *)local_50);
      QTextStream::operator<<(local_60,')');
      if (local_60[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_60,' ');
      }
      QDebug::~QDebug((QDebug *)&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug((QDebug *)local_78);
      do {
        if (pDVar8->numBuckets - 1 == uVar7) {
          uVar7 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    } while (uVar7 != 0 || pDVar8 != (Data *)0x0);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}